

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenSIMDTernarySetB(BinaryenExpressionRef expr,BinaryenExpressionRef bExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef bExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::SIMDTernary>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<SIMDTernary>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xcf4,
                  "void BinaryenSIMDTernarySetB(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (bExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = bExpr;
    return;
  }
  __assert_fail("bExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xcf5,"void BinaryenSIMDTernarySetB(BinaryenExpressionRef, BinaryenExpressionRef)")
  ;
}

Assistant:

void BinaryenSIMDTernarySetB(BinaryenExpressionRef expr,
                             BinaryenExpressionRef bExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDTernary>());
  assert(bExpr);
  static_cast<SIMDTernary*>(expression)->b = (Expression*)bExpr;
}